

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NodeCountAppearancesAll(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < (pNode->vFanouts).nSize; lVar3 = lVar3 + 1) {
    iVar1 = Abc_NodeCountAppearances
                      (pNode,(Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar3]]);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Abc_NodeCountAppearancesAll( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i, Count = 0;
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Count += Abc_NodeCountAppearances( pNode, pFanout );
    return Count;
}